

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,
                mrg_parameter<int,_3,_trng::mrg3> *P)

{
  undefined4 uVar1;
  char cVar2;
  long lVar3;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  cVar2 = '(';
  lVar3 = 0;
  do {
    std::operator<<(out,cVar2);
    do {
      if (lVar3 == 3) {
        std::operator<<(out,')');
        *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
        return out;
      }
      std::ostream::operator<<(out,P->a[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 3);
    cVar2 = ' ';
  } while( true );
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const mrg_parameter &P) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '(';
      for (int i{0}; i < n; ++i) {
        out << P.a[i];
        if (i + 1 < n)
          out << ' ';
      }
      out << ')';
      out.flags(flags);
      return out;
    }